

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypt.c
# Opt level: O2

void encrypt(char *__block,int __edflag)

{
  uchar *in_RDX;
  undefined4 in_register_00000034;
  
  gen_e(in_RDX);
  syndrome((uchar *)__block,(uchar *)CONCAT44(in_register_00000034,__edflag),in_RDX);
  return;
}

Assistant:

void encrypt(unsigned char *s, const unsigned char *pk, unsigned char *e)
{
	gen_e(e);

#ifdef KAT
  {
    int k;
    printf("encrypt e: positions");
    for (k = 0;k < SYS_N;++k)
      if (e[k/8] & (1 << (k&7)))
        printf(" %d",k);
    printf("\n");
  }
#endif

	syndrome(s, pk, e);
}